

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
          (InvalidInputException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  InvalidInputException *in_RDI;
  string local_80 [32];
  string local_60 [32];
  string local_40 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  
  params_00 = in_RCX;
  std::__cxx11::string::string(local_60,(string *)in_RDX);
  std::__cxx11::string::string(local_80,(string *)in_RCX);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string>
            (in_RDX,params_00,in_stack_ffffffffffffffd8);
  duckdb::InvalidInputException::InvalidInputException(in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}